

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynomial.c
# Opt level: O0

field_element_t
polynomial_eval_log_lut(field_t field,polynomial_t poly_log,field_logarithm_t *val_exp)

{
  field_t field_00;
  field_t field_01;
  field_element_t r;
  uint in_ECX;
  byte *in_RDX;
  field_logarithm_t *in_RSI;
  field_element_t *in_RDI;
  char *in_R8;
  uint i;
  field_element_t res;
  uint local_38;
  field_element_t local_31;
  field_element_t local_1;
  
  if (*in_R8 == '\0') {
    if (*in_RDX == 0) {
      local_1 = '\0';
    }
    else {
      local_1 = in_RDI[*in_RDX];
    }
  }
  else {
    local_31 = '\0';
    for (local_38 = 0; local_38 <= in_ECX; local_38 = local_38 + 1) {
      if (in_RDX[local_38] != 0) {
        field_00.log = in_RSI;
        field_00.exp = in_RDI;
        r = field_mul_log_element(field_00,in_RDX[local_38],in_R8[local_38]);
        field_01.log = in_RSI;
        field_01.exp = in_RDI;
        local_31 = field_add(field_01,local_31,r);
      }
    }
    local_1 = local_31;
  }
  return local_1;
}

Assistant:

field_element_t polynomial_eval_log_lut(field_t field, polynomial_t poly_log, const field_logarithm_t *val_exp) {
    // evaluate the log_polynomial poly at a particular element val
    // like polynomial_eval_lut, the logarithms of the successive powers of val have been
    //   precomputed
    if (val_exp[0] == 0) {
        if (poly_log.coeff[0] == 0) {
            // special case for the non-existant log case
            return 0;
        }
        return field.exp[poly_log.coeff[0]];
    }

    field_element_t res = 0;

    for (unsigned int i = 0; i <= poly_log.order; i++) {
        // using 0 as a sentinel value in log -- log(0) is really -inf
        if (poly_log.coeff[i] != 0) {
            // multiply-accumulate by the next coeff times the next power of val
            res = field_add(field, res,
                    field_mul_log_element(field, poly_log.coeff[i], val_exp[i]));
        }
    }
    return res;
}